

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O0

void branch(vec<Branching_*> *x,VarBranch var_branch,ValBranch val_branch)

{
  BranchGroup *pBVar1;
  BranchGroup *pBVar2;
  undefined8 in_RDI;
  vec<Branching_*> *unaff_retaddr;
  vec<Branching_*> *this;
  vec<Branching_*> *in_stack_ffffffffffffffd8;
  vec<Branching_*> *in_stack_ffffffffffffffe0;
  
  pBVar1 = engine.branching;
  this = (vec<Branching_*> *)&stack0xffffffffffffffe0;
  vec<Branching*>::vec<Branching*>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pBVar2 = createBranch(unaff_retaddr,(VarBranch)((ulong)in_RDI >> 0x20),(ValBranch)in_RDI);
  (*(pBVar1->super_Branching)._vptr_Branching[3])(pBVar1,pBVar2);
  vec<Branching_*>::~vec(this);
  return;
}

Assistant:

void branch(vec<Branching*> x, VarBranch var_branch, ValBranch val_branch) {
	engine.branching->add(createBranch(x, var_branch, val_branch));
}